

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SwapInlinedStringDonated
          (Reflection *this,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  Nonnull<const_char_*> failure_msg;
  ulong uVar8;
  int line;
  uint local_44;
  LogMessageFatal local_40;
  
  uVar5 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
  }
  uVar8 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar8 & 1) != 0) {
    uVar8 = *(ulong *)(uVar8 & 0xfffffffffffffffe);
  }
  if (uVar5 == uVar8) {
    bVar1 = IsInlinedStringDonated(this,lhs,field);
    bVar2 = IsInlinedStringDonated(this,rhs,field);
    if (bVar1 != bVar2) {
      puVar6 = MutableInlinedStringDonatedArray(this,lhs);
      puVar7 = MutableInlinedStringDonatedArray(this,rhs);
      local_40.super_LogMessage.errno_saver_.saved_errno_ = *puVar6 & 1;
      local_44 = 0;
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                              ((uint *)&local_40,&local_44,"lhs_array[0] & 0x1u == 0u");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        local_40.super_LogMessage.errno_saver_.saved_errno_ = *puVar7 & 1;
        local_44 = 0;
        failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                                ((uint *)&local_40,&local_44,"rhs_array[0] & 0x1u == 0u");
        if (failure_msg == (Nullable<const_char_*>)0x0) {
          uVar3 = internal::ReflectionSchema::InlinedStringIndex(&this->schema_,field);
          local_44 = 0;
          local_40.super_LogMessage.errno_saver_.saved_errno_ = uVar3;
          failure_msg = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                                  ((uint *)&local_40,&local_44,"index > 0u");
          if (failure_msg == (Nullable<const_char_*>)0x0) {
            uVar4 = 1 << ((byte)uVar3 & 0x1f);
            if (bVar2) {
              puVar6[uVar3 >> 5] = puVar6[uVar3 >> 5] | uVar4;
              puVar7[uVar3 >> 5] = puVar7[uVar3 >> 5] & ~uVar4;
              return;
            }
            puVar6[uVar3 >> 5] = puVar6[uVar3 >> 5] & ~uVar4;
            puVar7[uVar3 >> 5] = puVar7[uVar3 >> 5] | uVar4;
            return;
          }
          line = 0xbe4;
        }
        else {
          line = 0xbe1;
        }
      }
      else {
        line = 0xbe0;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,line,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
  }
  return;
}

Assistant:

void Reflection::SwapInlinedStringDonated(Message* lhs, Message* rhs,
                                          const FieldDescriptor* field) const {
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  // If arenas differ, inined string fields are swapped by copying values.
  // Donation status should not be swapped.
  if (lhs_arena != rhs_arena) {
    return;
  }
  bool lhs_donated = IsInlinedStringDonated(*lhs, field);
  bool rhs_donated = IsInlinedStringDonated(*rhs, field);
  if (lhs_donated == rhs_donated) {
    return;
  }
  // If one is undonated, both must have already registered ArenaDtor.
  uint32_t* lhs_array = MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = MutableInlinedStringDonatedArray(rhs);
  ABSL_CHECK_EQ(lhs_array[0] & 0x1u, 0u);
  ABSL_CHECK_EQ(rhs_array[0] & 0x1u, 0u);
  // Swap donation status bit.
  uint32_t index = schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  if (rhs_donated) {
    SetInlinedStringDonated(index, lhs_array);
    ClearInlinedStringDonated(index, rhs_array);
  } else {  // lhs_donated
    ClearInlinedStringDonated(index, lhs_array);
    SetInlinedStringDonated(index, rhs_array);
  }
}